

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charstr.cpp
# Opt level: O0

int __thiscall icu_63::CharString::truncate(CharString *this,char *__file,__off_t __length)

{
  char *pcVar1;
  int local_14;
  int32_t newLength_local;
  CharString *this_local;
  
  local_14 = (int)__file;
  if (local_14 < 0) {
    local_14 = 0;
  }
  if (local_14 < this->len) {
    this->len = local_14;
    pcVar1 = MaybeStackArray<char,_40>::operator[](&this->buffer,(long)local_14);
    *pcVar1 = '\0';
  }
  return (int)this;
}

Assistant:

CharString &CharString::truncate(int32_t newLength) {
    if(newLength<0) {
        newLength=0;
    }
    if(newLength<len) {
        buffer[len=newLength]=0;
    }
    return *this;
}